

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O0

Transform * __thiscall iDynTree::Axis::getTranslationTransform(Axis *this,double dist)

{
  VectorFixSize<3U> *pVVar1;
  double *pdVar2;
  Transform *in_RSI;
  Transform *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  Position translationPosition;
  double w;
  double v;
  double u;
  Transform *nonTranslated_T_translated;
  Rotation *in_stack_ffffffffffffff38;
  VectorFixSize<3U> local_90;
  double local_78;
  double local_70;
  double local_68;
  double local_18;
  
  local_18 = in_XMM0_Qa;
  Transform::Transform(in_RSI);
  Rotation::Identity();
  Transform::setRotation(in_RSI,in_stack_ffffffffffffff38);
  pVVar1 = &getDirection((Axis *)in_RSI)->super_Vector3;
  local_68 = VectorFixSize<3U>::operator()(pVVar1,0);
  pVVar1 = &getDirection((Axis *)in_RSI)->super_Vector3;
  local_70 = VectorFixSize<3U>::operator()(pVVar1,1);
  pVVar1 = &getDirection((Axis *)in_RSI)->super_Vector3;
  local_78 = VectorFixSize<3U>::operator()(pVVar1,2);
  Position::Position((Position *)0x6267d8);
  dVar3 = local_68 * local_18;
  pdVar2 = VectorFixSize<3U>::operator()(&local_90,0);
  *pdVar2 = dVar3;
  dVar3 = local_70 * local_18;
  pdVar2 = VectorFixSize<3U>::operator()(&local_90,1);
  *pdVar2 = dVar3;
  dVar3 = local_78 * local_18;
  pdVar2 = VectorFixSize<3U>::operator()(&local_90,2);
  *pdVar2 = dVar3;
  Transform::setPosition(in_RSI,(Position *)in_stack_ffffffffffffff38);
  return in_RDI;
}

Assistant:

Transform Axis::getTranslationTransform(const double dist) const
    {
        Transform nonTranslated_T_translated;

        //No rotation
        nonTranslated_T_translated.setRotation(iDynTree::Rotation::Identity());

        // translation
        double u   = this->getDirection()(0);
        double v   = this->getDirection()(1);
        double w   = this->getDirection()(2);
       
        Position translationPosition;
            
        //Translation because of joint variable    
        translationPosition(0) = u*dist;
        translationPosition(1) = v*dist;
        translationPosition(2) = w*dist;

        nonTranslated_T_translated.setPosition(translationPosition);

        return nonTranslated_T_translated;
    }